

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::GetFileName_abi_cxx11_
          (string *__return_storage_ptr__,python *this,FileDescriptor *file_des,string_view suffix)

{
  string_view filename;
  string module_name;
  string local_78;
  undefined1 local_58 [48];
  
  filename._M_str = (char *)suffix._M_len;
  filename._M_len = **(size_t **)(this + 8);
  ModuleName_abi_cxx11_(&local_78,(python *)(*(size_t **)(this + 8))[1],filename);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  local_58._0_8_ = 1;
  local_58._8_8_ = ".";
  local_58[0x10] = '\x01';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58._24_8_ = "/";
  absl::lts_20240722::StrReplaceAll(local_58,1,__return_storage_ptr__);
  local_58._0_8_ = file_des;
  local_58._8_8_ = filename._M_str;
  absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,(AlphaNum *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileName(const FileDescriptor* file_des,
                        absl::string_view suffix) {
  std::string module_name = ModuleName(file_des->name());
  std::string filename = module_name;
  absl::StrReplaceAll({{".", "/"}}, &filename);
  absl::StrAppend(&filename, suffix);
  return filename;
}